

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_call(lua_State *L,StkId func,int nResults)

{
  ushort uVar1;
  int iVar2;
  int nResults_local;
  StkId func_local;
  lua_State *L_local;
  
  uVar1 = L->nCcalls + 1;
  L->nCcalls = uVar1;
  if (0x7c < uVar1) {
    stackerror(L);
  }
  iVar2 = luaD_precall(L,func,nResults,0);
  if (iVar2 == 0) {
    luaV_execute(L);
  }
  L->nCcalls = L->nCcalls - 1;
  return;
}

Assistant:

void luaD_call (lua_State *L, StkId func, int nResults) {
  if (++L->nCcalls >= LUAI_MAXCCALLS)
    stackerror(L);
  if (!luaD_precall(L, func, nResults, 0))  /* is a Lua function? */ {
    luaV_execute(L);  /* call it */
  }
  L->nCcalls--;
}